

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<CoreML::MilStoragePython::MilStoragePythonWriter> * __thiscall
pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(pybind11::array_t<unsigned_char,16>const&)>
          (class_<CoreML::MilStoragePython::MilStoragePythonWriter> *this,char *name_,
          offset_in_MilStoragePythonWriter_to_subr *f)

{
  offset_in_MilStoragePythonWriter_to_subr f_00;
  name *extra;
  PyObject *pPVar1;
  handle hVar2;
  cpp_function cf;
  handle local_60;
  handle local_58;
  handle local_50;
  handle local_48;
  is_method local_40;
  PyObject *local_38;
  
  f_00 = *f;
  extra = (name *)f[1];
  pPVar1 = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_50.m_ptr = (PyObject *)&_Py_NoneStruct;
  local_48.m_ptr = pPVar1;
  local_40.class_.m_ptr = (handle)(handle)name_;
  handle::inc_ref(&local_50);
  hVar2.m_ptr = local_50.m_ptr;
  local_60.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,name_);
  if (local_60.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_60.m_ptr = hVar2.m_ptr;
    handle::inc_ref(&local_60);
  }
  local_38 = local_60.m_ptr;
  cpp_function::
  cpp_function<unsigned_long,CoreML::MilStoragePython::MilStoragePythonWriter,pybind11::array_t<unsigned_char,16>const&,pybind11::name,pybind11::is_method,pybind11::sibling>
            ((cpp_function *)&local_58,f_00,extra,&local_40,(sibling *)&local_48);
  handle::dec_ref(&local_60);
  handle::dec_ref(&local_50);
  detail::add_class_method((object *)this,name_,(cpp_function *)&local_58);
  handle::dec_ref(&local_58);
  return this;
}

Assistant:

class_ &def(const char *name_, Func &&f, const Extra &...extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)),
                        name(name_),
                        is_method(*this),
                        sibling(getattr(*this, name_, none())),
                        extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }